

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cpp
# Opt level: O0

void __thiscall Block::DeleteRecord(Block *this,float key)

{
  size_type sVar1;
  ostream *this_00;
  reference pvVar2;
  __normal_iterator<Record_*,_std::vector<Record,_std::allocator<Record>_>_> local_50;
  __normal_iterator<Record_*,_std::vector<Record,_std::allocator<Record>_>_> local_48;
  const_iterator local_40;
  int local_34;
  undefined1 local_30 [4];
  int i;
  vector<int,_std::allocator<int>_> deletePos;
  float key_local;
  Block *this_local;
  
  deletePos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = key;
  sVar1 = std::vector<Record,_std::allocator<Record>_>::size(&this->records);
  if (sVar1 == 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "[Block::DeleteRecord] error, no record avaliable");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_30);
    sVar1 = std::vector<Record,_std::allocator<Record>_>::size(&this->records);
    local_34 = (int)sVar1;
    while (local_34 = local_34 + -1, -1 < local_34) {
      pvVar2 = std::vector<Record,_std::allocator<Record>_>::operator[]
                         (&this->records,(long)local_34);
      if (((float)pvVar2->numVotes ==
           deletePos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_) &&
         (!NAN((float)pvVar2->numVotes) &&
          !NAN(deletePos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_))) {
        local_50._M_current =
             (Record *)std::vector<Record,_std::allocator<Record>_>::begin(&this->records);
        local_48 = __gnu_cxx::
                   __normal_iterator<Record_*,_std::vector<Record,_std::allocator<Record>_>_>::
                   operator+(&local_50,(long)local_34);
        __gnu_cxx::__normal_iterator<Record_const*,std::vector<Record,std::allocator<Record>>>::
        __normal_iterator<Record*>
                  ((__normal_iterator<Record_const*,std::vector<Record,std::allocator<Record>>> *)
                   &local_40,&local_48);
        std::vector<Record,_std::allocator<Record>_>::erase(&this->records,local_40);
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  }
  return;
}

Assistant:

void Block::DeleteRecord(float key) {
    if (records.size() == 0) {
        std::cerr << "[Block::DeleteRecord] error, no record avaliable" << std::endl;
        return;
    }
    std::vector<int> deletePos;
    for (int i = records.size()-1; i >= 0; i--) {
        if (records[i].numVotes == key) {
            records.erase(records.begin() + i);
        }
    }
}